

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmParser.cpp
# Opt level: O0

bool __thiscall
ArmParser::parseShift(ArmParser *this,Parser *parser,ArmOpcodeVariables *vars,bool immediateOnly)

{
  long lVar1;
  bool bVar2;
  Token *pTVar3;
  Identifier *this_00;
  string *psVar4;
  char *pcVar5;
  Expression local_a0;
  undefined4 local_84;
  long local_80;
  int64_t multiplier;
  int64_t number;
  byte local_59;
  undefined1 local_58 [7];
  bool hasNumber;
  string stringValue;
  Token *shiftMode;
  bool immediateOnly_local;
  ArmOpcodeVariables *vars_local;
  Parser *parser_local;
  ArmParser *this_local;
  
  (vars->Shift).UseShift = false;
  pTVar3 = Parser::peekToken(parser,0);
  if (pTVar3->type != Comma) {
    return true;
  }
  Parser::eatToken(parser);
  stringValue.field_2._8_8_ = Parser::nextToken(parser);
  if (((Token *)stringValue.field_2._8_8_)->type != Identifier) {
    return false;
  }
  this_00 = Token::identifierValue((Token *)stringValue.field_2._8_8_);
  psVar4 = Identifier::string_abi_cxx11_(this_00);
  std::__cxx11::string::string((string *)local_58,(string *)psVar4);
  pcVar5 = (char *)std::__cxx11::string::back();
  local_59 = isNumber(*pcVar5);
  multiplier = 0;
  if ((bool)local_59) {
    local_80 = 1;
    while( true ) {
      pcVar5 = (char *)std::__cxx11::string::back();
      bVar2 = isNumber(*pcVar5);
      lVar1 = local_80;
      if (!bVar2) break;
      pcVar5 = (char *)std::__cxx11::string::back();
      multiplier = lVar1 * (*pcVar5 + -0x30) + multiplier;
      local_80 = local_80 * 10;
      std::__cxx11::string::pop_back();
    }
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_58,"lsl");
  if ((bVar2) ||
     (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_58,"asl"), bVar2)) {
    (vars->Shift).Type = '\0';
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_58,"lsr");
    if (bVar2) {
      (vars->Shift).Type = '\x01';
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_58,"asr");
      if (bVar2) {
        (vars->Shift).Type = '\x02';
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_58,"ror");
        if (bVar2) {
          (vars->Shift).Type = '\x03';
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_58,"rrx");
          if (!bVar2) {
            this_local._7_1_ = false;
            goto LAB_001bdbe7;
          }
          (vars->Shift).Type = '\x04';
        }
      }
    }
  }
  if ((local_59 & 1) == 0) {
    bVar2 = parseRegister(this,parser,&(vars->Shift).reg,0xf);
    if (bVar2) {
      if (immediateOnly) {
        this_local._7_1_ = false;
        goto LAB_001bdbe7;
      }
      (vars->Shift).ShiftByRegister = true;
    }
    else {
      pTVar3 = Parser::peekToken(parser,0);
      if (pTVar3->type == Hash) {
        Parser::eatToken(parser);
      }
      bVar2 = parseImmediate(this,parser,&(vars->Shift).ShiftExpression);
      if (!bVar2) {
        this_local._7_1_ = false;
        goto LAB_001bdbe7;
      }
      (vars->Shift).ShiftByRegister = false;
    }
  }
  else {
    createConstExpression(&local_a0,multiplier);
    Expression::operator=(&(vars->Shift).ShiftExpression,&local_a0);
    Expression::~Expression(&local_a0);
    (vars->Shift).ShiftByRegister = false;
  }
  (vars->Shift).UseShift = true;
  this_local._7_1_ = true;
LAB_001bdbe7:
  local_84 = 1;
  std::__cxx11::string::~string((string *)local_58);
  return this_local._7_1_;
}

Assistant:

bool ArmParser::parseShift(Parser& parser, ArmOpcodeVariables& vars, bool immediateOnly)
{
	// no shift is also valid
	vars.Shift.UseShift = false;
	if (parser.peekToken().type != TokenType::Comma)
		return true;

	parser.eatToken();

	// load shift mode
	const Token& shiftMode = parser.nextToken();
	if (shiftMode.type != TokenType::Identifier)
		return false;

	std::string stringValue = shiftMode.identifierValue().string();
	
	bool hasNumber = isNumber(stringValue.back());
	int64_t number = 0;

	// handle modeXX syntax
	if (hasNumber)
	{
		int64_t multiplier = 1;
		while (isNumber(stringValue.back()))
		{
			number += multiplier*(stringValue.back() - '0');
			multiplier *= 10;
			stringValue.pop_back();
		}
	}

	if (stringValue == "lsl" || stringValue == "asl")
		vars.Shift.Type = 0;
	else if (stringValue == "lsr")
		vars.Shift.Type = 1;
	else if (stringValue == "asr")
		vars.Shift.Type = 2;
	else if (stringValue == "ror")
		vars.Shift.Type = 3;
	else if (stringValue == "rrx")
		vars.Shift.Type = 4;
	else 
		return false;

	if (hasNumber)
	{
		vars.Shift.ShiftExpression = createConstExpression(number);
		vars.Shift.ShiftByRegister = false;
	} else if (parseRegister(parser,vars.Shift.reg))
	{
		if (immediateOnly)
			return false;

		vars.Shift.ShiftByRegister = true;
	} else {
		if (parser.peekToken().type == TokenType::Hash)
			parser.eatToken();
		
		if (!parseImmediate(parser,vars.Shift.ShiftExpression))
			return false;

		vars.Shift.ShiftByRegister = false;
	}
	
	vars.Shift.UseShift = true;
	return true;
}